

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_hd.c
# Opt level: O0

int hd_inflate_commit_newname(nghttp2_hd_inflater *inflater,nghttp2_hd_nv *nv_out)

{
  undefined1 auStack_38 [4];
  int rv;
  nghttp2_hd_nv nv;
  nghttp2_hd_nv *nv_out_local;
  nghttp2_hd_inflater *inflater_local;
  
  nv.value._4_1_ = inflater->no_index != '\0';
  _auStack_38 = inflater->namercbuf;
  nv.name = inflater->valuercbuf;
  nv._16_8_ = nv_out;
  nv.value._0_4_ = lookup_token(inflater->namercbuf->base,inflater->namercbuf->len);
  if ((inflater->index_required == '\0') ||
     (inflater_local._4_4_ =
           add_hd_table_incremental
                     (&inflater->ctx,(nghttp2_hd_nv *)auStack_38,(nghttp2_hd_map *)0x0,0),
     inflater_local._4_4_ == 0)) {
    emit_header((nghttp2_hd_nv *)nv._16_8_,(nghttp2_hd_nv *)auStack_38);
    inflater->nv_name_keep = _auStack_38;
    inflater->nv_value_keep = nv.name;
    inflater->namercbuf = (nghttp2_rcbuf *)0x0;
    inflater->valuercbuf = (nghttp2_rcbuf *)0x0;
    inflater_local._4_4_ = 0;
  }
  return inflater_local._4_4_;
}

Assistant:

static int hd_inflate_commit_newname(nghttp2_hd_inflater *inflater,
                                     nghttp2_hd_nv *nv_out) {
  nghttp2_hd_nv nv;
  int rv;

  if (inflater->no_index) {
    nv.flags = NGHTTP2_NV_FLAG_NO_INDEX;
  } else {
    nv.flags = NGHTTP2_NV_FLAG_NONE;
  }

  nv.name = inflater->namercbuf;
  nv.value = inflater->valuercbuf;
  nv.token = lookup_token(inflater->namercbuf->base, inflater->namercbuf->len);

  if (inflater->index_required) {
    rv = add_hd_table_incremental(&inflater->ctx, &nv, NULL, 0);

    if (rv != 0) {
      return rv;
    }
  }

  emit_header(nv_out, &nv);

  inflater->nv_name_keep = nv.name;
  inflater->nv_value_keep = nv.value;

  inflater->namercbuf = NULL;
  inflater->valuercbuf = NULL;

  return 0;
}